

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O1

void duckdb::RLEScanPartialInternal<double,false>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  undefined8 uVar1;
  uint uVar2;
  _func_int *p_Var3;
  idx_t iVar4;
  data_ptr_t pdVar5;
  _func_int **pp_Var6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  pointer pSVar9;
  ulong uVar10;
  ulong uVar11;
  _func_int **pp_Var12;
  _func_int **pp_Var13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  
  pSVar9 = unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
           ::operator->(&state->scan_state);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid
            ((optional_ptr<duckdb::FileBuffer,_true> *)(pSVar9 + 3));
  p_Var3 = pSVar9[3]._vptr_SegmentScanState[2];
  iVar4 = segment->offset;
  uVar2 = *(uint *)&pSVar9[6]._vptr_SegmentScanState;
  pdVar5 = result->data;
  Vector::SetVectorType(result,FLAT_VECTOR);
  auVar8 = _DAT_0135e310;
  auVar7 = _DAT_01356200;
  uVar17 = scan_count + result_offset;
  do {
    uVar10 = uVar17 - result_offset;
    if (uVar17 < result_offset || uVar10 == 0) {
      return;
    }
    pp_Var6 = pSVar9[4]._vptr_SegmentScanState;
    pp_Var12 = pSVar9[5]._vptr_SegmentScanState;
    pp_Var13 = (_func_int **)(ulong)*(ushort *)(p_Var3 + (long)pp_Var6 * 2 + uVar2 + iVar4);
    uVar11 = (long)pp_Var13 - (long)pp_Var12;
    uVar1 = *(undefined8 *)(p_Var3 + (long)pp_Var6 * 8 + iVar4 + 8);
    if (uVar10 < uVar11) {
      lVar14 = uVar10 + (uVar10 == 0);
      lVar15 = lVar14 + -1;
      auVar19._8_4_ = (int)lVar15;
      auVar19._0_8_ = lVar15;
      auVar19._12_4_ = (int)((ulong)lVar15 >> 0x20);
      auVar19 = auVar19 ^ auVar7;
      uVar16 = 0;
      auVar20 = auVar8;
      do {
        auVar21 = auVar20 ^ auVar7;
        if ((bool)(~(auVar19._4_4_ < auVar21._4_4_ ||
                    auVar19._0_4_ < auVar21._0_4_ && auVar21._4_4_ == auVar19._4_4_) & 1)) {
          *(undefined8 *)(pdVar5 + uVar16 * 8 + result_offset * 8) = uVar1;
        }
        if (auVar21._12_4_ <= auVar19._12_4_ &&
            (auVar21._8_4_ <= auVar19._8_4_ || auVar21._12_4_ != auVar19._12_4_)) {
          *(undefined8 *)(pdVar5 + uVar16 * 8 + result_offset * 8 + 8) = uVar1;
        }
        uVar16 = uVar16 + 2;
        lVar15 = auVar20._8_8_;
        auVar20._0_8_ = auVar20._0_8_ + 2;
        auVar20._8_8_ = lVar15 + 2;
      } while ((lVar14 + 1U & 0xfffffffffffffffe) != uVar16);
      pp_Var12 = (_func_int **)((long)pp_Var12 + uVar10);
    }
    else {
      if (pp_Var13 != pp_Var12) {
        lVar14 = uVar11 - 1;
        auVar18._8_4_ = (int)lVar14;
        auVar18._0_8_ = lVar14;
        auVar18._12_4_ = (int)((ulong)lVar14 >> 0x20);
        auVar18 = auVar18 ^ auVar7;
        uVar16 = 0;
        auVar21 = auVar8;
        do {
          auVar20 = auVar21 ^ auVar7;
          if ((bool)(~(auVar18._4_4_ < auVar20._4_4_ ||
                      auVar18._0_4_ < auVar20._0_4_ && auVar20._4_4_ == auVar18._4_4_) & 1)) {
            *(undefined8 *)(pdVar5 + uVar16 * 8 + result_offset * 8) = uVar1;
          }
          if (auVar20._12_4_ <= auVar18._12_4_ &&
              (auVar20._8_4_ <= auVar18._8_4_ || auVar20._12_4_ != auVar18._12_4_)) {
            *(undefined8 *)(pdVar5 + uVar16 * 8 + result_offset * 8 + 8) = uVar1;
          }
          uVar16 = uVar16 + 2;
          lVar14 = auVar21._8_8_;
          auVar21._0_8_ = auVar21._0_8_ + 2;
          auVar21._8_8_ = lVar14 + 2;
        } while ((uVar11 + 1 & 0xfffffffffffffffe) != uVar16);
      }
      result_offset = result_offset + uVar11;
      pSVar9[4]._vptr_SegmentScanState = (_func_int **)((long)pp_Var6 + 1);
      pp_Var12 = (_func_int **)0x0;
    }
    pSVar9[5]._vptr_SegmentScanState = pp_Var12;
  } while (uVar11 <= uVar10);
  return;
}

Assistant:

void RLEScanPartialInternal(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                            idx_t result_offset) {
	auto &scan_state = state.scan_state->Cast<RLEScanState<T>>();

	auto data = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto data_pointer = reinterpret_cast<T *>(data + RLEConstants::RLE_HEADER_SIZE);
	auto index_pointer = reinterpret_cast<rle_count_t *>(data + scan_state.rle_count_offset);

	// If we are scanning an entire Vector and it contains only a single run
	if (CanEmitConstantVector<ENTIRE_VECTOR>(scan_state.position_in_entry, index_pointer[scan_state.entry_pos],
	                                         scan_count)) {
		RLEScanConstant<T>(scan_state, index_pointer, data_pointer, scan_count, result);
		return;
	}

	auto result_data = FlatVector::GetData<T>(result);
	result.SetVectorType(VectorType::FLAT_VECTOR);

	idx_t result_end = result_offset + scan_count;
	while (result_offset < result_end) {
		rle_count_t run_end = index_pointer[scan_state.entry_pos];
		idx_t run_count = run_end - scan_state.position_in_entry;
		idx_t remaining_scan_count = result_end - result_offset;
		T element = data_pointer[scan_state.entry_pos];
		if (DUCKDB_UNLIKELY(run_count > remaining_scan_count)) {
			for (idx_t i = 0; i < remaining_scan_count; i++) {
				result_data[result_offset + i] = element;
			}
			scan_state.position_in_entry += remaining_scan_count;
			break;
		}

		for (idx_t i = 0; i < run_count; i++) {
			result_data[result_offset + i] = element;
		}

		result_offset += run_count;
		scan_state.ForwardToNextRun();
	}
}